

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O2

void __thiscall mocker::nasm::Db::~Db(Db *this)

{
  (this->super_Inst)._vptr_Inst = (_func_int **)&PTR__Db_001f09f0;
  std::__cxx11::string::~string((string *)&this->data);
  return;
}

Assistant:

explicit Db(std::string data) : data(std::move(data)) {}